

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t count_greater(uint16_t *array,int32_t lenarray,uint16_t ikey)

{
  int32_t iVar1;
  int32_t pos;
  uint16_t ikey_local;
  int32_t lenarray_local;
  uint16_t *array_local;
  
  if (lenarray == 0) {
    array_local._4_4_ = 0;
  }
  else {
    iVar1 = binarySearch(array,lenarray,ikey);
    if (iVar1 < 0) {
      array_local._4_4_ = lenarray - (-1 - iVar1);
    }
    else {
      array_local._4_4_ = lenarray - (iVar1 + 1);
    }
  }
  return array_local._4_4_;
}

Assistant:

static inline int32_t count_greater(const uint16_t *array, int32_t lenarray,
                                    uint16_t ikey) {
    if (lenarray == 0) return 0;
    int32_t pos = binarySearch(array, lenarray, ikey);
    if (pos >= 0) {
        return lenarray - (pos+1);
    } else {
        return lenarray - (-pos-1);
    }
}